

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json
               (json *j,field<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>
                        *f)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_impl<std::less<discordpp::Snowflake>,_true> *p_Var3;
  state sVar4;
  pointer __p;
  pointer __p_00;
  _Rb_tree<discordpp::Snowflake,_std::pair<const_discordpp::Snowflake,_discordpp::Attachment>,_std::_Select1st<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>
  _Stack_48;
  __uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
  local_18;
  
  if (j->m_type == null) {
    std::
    __uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
             *)f,(pointer)0x0);
    sVar4 = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_0>
              (&_Stack_48,j);
    __p_00 = (pointer)operator_new(0x30);
    p_Var1 = &(__p_00->_M_t)._M_impl.super__Rb_tree_header;
    if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      p_Var3 = &(__p_00->_M_t)._M_impl;
    }
    else {
      p_Var2 = &_Stack_48._M_impl.super__Rb_tree_header;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
      p_Var3 = &_Stack_48._M_impl;
      (__p_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    (p_Var3->super__Rb_tree_header)._M_node_count = 0;
    local_18._M_t.
    super__Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
    .
    super__Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_*,_false>
    ._M_head_impl =
         (tuple<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
          )(_Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
             *)f,__p_00);
    std::
    unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
                   *)&local_18);
    std::
    _Rb_tree<discordpp::Snowflake,_std::pair<const_discordpp::Snowflake,_discordpp::Attachment>,_std::_Select1st<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>
    ::~_Rb_tree(&_Stack_48);
    sVar4 = present_e;
  }
  f->s_ = sVar4;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }